

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_sse4.c
# Opt level: O3

void av1_build_compound_diffwtd_mask_d16_sse4_1
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,CONV_BUF_TYPE *src0,int src0_stride,
               CONV_BUF_TYPE *src1,int src1_stride,int h,int w,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  undefined7 in_register_00000031;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  undefined1 in_XMM4 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar17 [16];
  ushort uVar19;
  short sVar20;
  ushort uVar24;
  short sVar25;
  undefined4 uVar21;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  short sVar33;
  ushort uVar34;
  short sVar35;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ushort uVar37;
  short sVar38;
  undefined1 auVar39 [16];
  ushort uVar18;
  ushort uVar36;
  
  uVar7 = (bd - (conv_params->round_0 + conv_params->round_1)) + 6;
  if (0 < h) {
    auVar12 = ZEXT416((uint)(1 << ((byte)uVar7 & 0x1f)) >> 1);
    auVar12 = pshuflw(auVar12,auVar12,0);
    auVar12._4_4_ = auVar12._0_4_;
    auVar12._8_4_ = auVar12._0_4_;
    auVar12._12_4_ = auVar12._0_4_;
    uVar9 = (uint)((int)CONCAT71(in_register_00000031,mask_type) != 0);
    auVar13 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
    auVar13._4_4_ = auVar13._0_4_;
    auVar13._8_4_ = auVar13._0_4_;
    auVar13._12_4_ = auVar13._0_4_;
    auVar13 = psllw(auVar13,6);
    auVar14 = pshuflw(ZEXT416(-uVar9 | 1),ZEXT416(-uVar9 | 1),0);
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = auVar14._0_4_;
    auVar14._12_4_ = auVar14._0_4_;
    lVar10 = (long)w;
    uVar11 = 0;
    auVar16 = pmovsxbw(in_XMM4,0x1a1a1a1a1a1a1a1a);
    auVar17 = pmovsxbw(in_XMM5,0x2626262626262626);
    do {
      if (0 < w) {
        lVar8 = 0;
        do {
          auVar39 = psubusw(*(undefined1 (*) [16])(src0 + lVar8),
                            *(undefined1 (*) [16])(src1 + lVar8));
          auVar22 = psubusw(*(undefined1 (*) [16])(src1 + lVar8),
                            *(undefined1 (*) [16])(src0 + lVar8));
          uVar6 = auVar39._0_2_;
          uVar18 = auVar22._0_2_;
          auVar23._0_2_ = (uVar18 < uVar6) * uVar6 | (uVar18 >= uVar6) * uVar18;
          uVar6 = auVar39._2_2_;
          uVar18 = auVar22._2_2_;
          auVar23._2_2_ = (uVar18 < uVar6) * uVar6 | (uVar18 >= uVar6) * uVar18;
          uVar6 = auVar39._4_2_;
          uVar18 = auVar22._4_2_;
          auVar23._4_2_ = (uVar18 < uVar6) * uVar6 | (uVar18 >= uVar6) * uVar18;
          uVar6 = auVar39._6_2_;
          uVar18 = auVar22._6_2_;
          auVar23._6_2_ = (uVar18 < uVar6) * uVar6 | (uVar18 >= uVar6) * uVar18;
          uVar6 = auVar39._8_2_;
          uVar18 = auVar22._8_2_;
          auVar23._8_2_ = (uVar18 < uVar6) * uVar6 | (uVar18 >= uVar6) * uVar18;
          uVar6 = auVar39._10_2_;
          uVar18 = auVar22._10_2_;
          auVar23._10_2_ = (uVar18 < uVar6) * uVar6 | (uVar18 >= uVar6) * uVar18;
          uVar6 = auVar39._12_2_;
          uVar18 = auVar22._12_2_;
          uVar36 = auVar22._14_2_;
          auVar23._12_2_ = (uVar18 < uVar6) * uVar6 | (uVar18 >= uVar6) * uVar18;
          uVar6 = auVar39._14_2_;
          auVar23._14_2_ = (uVar36 < uVar6) * uVar6 | (uVar36 >= uVar6) * uVar36;
          auVar22 = paddusw(auVar23,auVar12);
          uVar15 = (ulong)uVar7;
          uVar19 = (ushort)(auVar22._0_2_ >> uVar15) >> 4;
          uVar24 = (ushort)(auVar22._2_2_ >> uVar15) >> 4;
          uVar26 = (ushort)(auVar22._4_2_ >> uVar15) >> 4;
          uVar28 = (ushort)(auVar22._6_2_ >> uVar15) >> 4;
          uVar30 = (ushort)(auVar22._8_2_ >> uVar15) >> 4;
          uVar32 = (ushort)(auVar22._10_2_ >> uVar15) >> 4;
          uVar34 = (ushort)(auVar22._12_2_ >> uVar15) >> 4;
          uVar37 = (ushort)(auVar22._14_2_ >> uVar15) >> 4;
          uVar6 = auVar16._0_2_;
          uVar18 = auVar16._2_2_;
          uVar36 = auVar16._4_2_;
          uVar1 = auVar16._6_2_;
          uVar2 = auVar16._8_2_;
          uVar3 = auVar16._10_2_;
          uVar4 = auVar16._12_2_;
          uVar5 = auVar16._14_2_;
          auVar22._0_2_ = ((uVar6 < uVar19) * uVar6 | (uVar6 >= uVar19) * uVar19) + auVar17._0_2_;
          auVar22._2_2_ = ((uVar18 < uVar24) * uVar18 | (uVar18 >= uVar24) * uVar24) + auVar17._2_2_
          ;
          auVar22._4_2_ = ((uVar36 < uVar26) * uVar36 | (uVar36 >= uVar26) * uVar26) + auVar17._4_2_
          ;
          auVar22._6_2_ = ((uVar1 < uVar28) * uVar1 | (uVar1 >= uVar28) * uVar28) + auVar17._6_2_;
          auVar22._8_2_ = ((uVar2 < uVar30) * uVar2 | (uVar2 >= uVar30) * uVar30) + auVar17._8_2_;
          auVar22._10_2_ = ((uVar3 < uVar32) * uVar3 | (uVar3 >= uVar32) * uVar32) + auVar17._10_2_;
          auVar22._12_2_ = ((uVar4 < uVar34) * uVar4 | (uVar4 >= uVar34) * uVar34) + auVar17._12_2_;
          auVar22._14_2_ = ((uVar5 < uVar37) * uVar5 | (uVar5 >= uVar37) * uVar37) + auVar17._14_2_;
          auVar22 = psignw(auVar22,auVar14);
          sVar20 = auVar22._0_2_ + auVar13._0_2_;
          sVar25 = auVar22._2_2_ + auVar13._2_2_;
          sVar27 = auVar22._4_2_ + auVar13._4_2_;
          sVar29 = auVar22._6_2_ + auVar13._6_2_;
          sVar31 = auVar22._8_2_ + auVar13._8_2_;
          sVar33 = auVar22._10_2_ + auVar13._10_2_;
          sVar35 = auVar22._12_2_ + auVar13._12_2_;
          sVar38 = auVar22._14_2_ + auVar13._14_2_;
          uVar21 = CONCAT13((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29),
                            CONCAT12((0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 -
                                     (0xff < sVar27),
                                     CONCAT11((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 -
                                              (0xff < sVar25),
                                              (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 -
                                              (0xff < sVar20))));
          if (lVar8 < lVar10 + -4) {
            *(ulong *)(mask + lVar8) =
                 CONCAT17((0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38),
                          CONCAT16((0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35),
                                   CONCAT15((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 -
                                            (0xff < sVar33),
                                            CONCAT14((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31
                                                     - (0xff < sVar31),uVar21))));
          }
          else {
            *(undefined4 *)(mask + lVar8) = uVar21;
          }
          lVar8 = lVar8 + 8;
        } while (lVar8 < lVar10);
      }
      uVar11 = uVar11 + 1;
      mask = mask + lVar10;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    } while (uVar11 != (uint)h);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_d16_sse4_1(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const CONV_BUF_TYPE *src0,
    int src0_stride, const CONV_BUF_TYPE *src1, int src1_stride, int h, int w,
    ConvolveParams *conv_params, int bd) {
  const int which_inverse = (mask_type == DIFFWTD_38) ? 0 : 1;
  const int mask_base = 38;
  int round =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1 + (bd - 8);
  const __m128i round_const = _mm_set1_epi16((1 << round) >> 1);
  const __m128i mask_base_16 = _mm_set1_epi16(mask_base);
  const __m128i clip_diff = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i add_const =
      _mm_set1_epi16((which_inverse ? AOM_BLEND_A64_MAX_ALPHA : 0));
  const __m128i add_sign = _mm_set1_epi16((which_inverse ? -1 : 1));

  int i, j;
  // When rounding constant is added, there is a possibility of overflow.
  // However that much precision is not required. Code should very well work for
  // other values of DIFF_FACTOR_LOG2 and AOM_BLEND_A64_MAX_ALPHA as well. But
  // there is a possibility of corner case bugs.
  assert(DIFF_FACTOR_LOG2 == 4);
  assert(AOM_BLEND_A64_MAX_ALPHA == 64);
  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; j += 8) {
      const __m128i data_src0 =
          _mm_loadu_si128((__m128i *)&src0[(i * src0_stride) + j]);
      const __m128i data_src1 =
          _mm_loadu_si128((__m128i *)&src1[(i * src1_stride) + j]);

      const __m128i diffa = _mm_subs_epu16(data_src0, data_src1);
      const __m128i diffb = _mm_subs_epu16(data_src1, data_src0);
      const __m128i diff = _mm_max_epu16(diffa, diffb);
      const __m128i diff_round =
          _mm_srli_epi16(_mm_adds_epu16(diff, round_const), round);
      const __m128i diff_factor = _mm_srli_epi16(diff_round, DIFF_FACTOR_LOG2);
      const __m128i diff_mask = _mm_adds_epi16(diff_factor, mask_base_16);
      __m128i diff_clamp = _mm_min_epi16(diff_mask, clip_diff);
      // clamp to 0 can be skipped since we are using add and saturate
      // instruction

      const __m128i diff_sign = _mm_sign_epi16(diff_clamp, add_sign);
      const __m128i diff_const_16 = _mm_add_epi16(diff_sign, add_const);

      // 8 bit conversion and saturation to uint8
      const __m128i res_8 = _mm_packus_epi16(diff_const_16, diff_const_16);

      // Store values into the destination buffer
      __m128i *const dst = (__m128i *)&mask[i * w + j];

      if ((w - j) > 4) {
        _mm_storel_epi64(dst, res_8);
      } else {  // w==4
        *(int *)dst = _mm_cvtsi128_si32(res_8);
      }
    }
  }
}